

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O3

void __thiscall
baryonyx::details::pi_pnm_observer::pi_pnm_observer
          (pi_pnm_observer *this,string_view filename,int m,int param_3,long loop)

{
  string_view format_str;
  format_args args;
  string local_58;
  char *local_38;
  size_t local_30;
  
  local_38 = filename._M_str;
  local_30 = filename._M_len;
  this->constraints = m;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x9;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )loop;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  ::fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)"{}-pi.pnm",format_str,args);
  pnm_vector::pnm_vector(&this->m_pnm,&local_58,this->constraints,loop);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

pi_pnm_observer(const std::string_view filename,
                    int m,
                    int /*n*/,
                    long int loop)
      : constraints(m)
      , m_pnm(fmt::format("{}-pi.pnm", filename), constraints, loop)
    {}